

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::removeNamedItem(QDomNamedNodeMapPrivate *this,QString *name)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  const_iterator local_38;
  long local_20;
  QDomNodePrivate *pQVar2;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->readonly == false) {
    local_38.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_38.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)
                   &DAT_aaaaaaaaaaaaaaaa;
    local_38.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QMultiHash<QString,_QDomNodePrivate_*>::constFindImpl<QString>(&local_38,&this->map,name);
    if ((local_38.e != (Chain **)0x0) &&
       (pQVar2 = (*local_38.e)->value, pQVar2 != (QDomNodePrivate *)0x0)) {
      if (this->appendToParent == true) {
        iVar1 = (*this->parent->_vptr_QDomNodePrivate[6])(this->parent,pQVar2);
        pQVar2 = (QDomNodePrivate *)CONCAT44(extraout_var,iVar1);
      }
      else {
        local_38.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)
                       (pQVar2->name).d.d;
        local_38.i.bucket = (size_t)(pQVar2->name).d.ptr;
        local_38.e = (Chain **)(pQVar2->name).d.size;
        if (local_38.i.d != (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0) {
          LOCK();
          (((QArrayData *)&(local_38.i.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&(local_38.i.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        QMultiHash<QString,_QDomNodePrivate_*>::removeImpl<QString>(&this->map,(QString *)&local_38)
        ;
        if (local_38.i.d != (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0) {
          LOCK();
          ((local_38.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
               ((local_38.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_38.i.d,2,0x10);
          }
        }
        LOCK();
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
      goto LAB_00110908;
    }
  }
  pQVar2 = (QDomNodePrivate *)0x0;
LAB_00110908:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::removeNamedItem(const QString& name)
{
    if (readonly)
        return nullptr;

    QDomNodePrivate* p = namedItem(name);
    if (p == nullptr)
        return nullptr;
    if (appendToParent)
        return parent->removeChild(p);

    map.remove(p->nodeName());
    // We took a reference, so we have to free one here
    p->ref.deref();
    return p;
}